

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

size_t __thiscall caffe::BlobShape::ByteSizeLong(BlobShape *this)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  uint uVar4;
  ulong *puVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  int index;
  
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    sVar8 = 0;
  }
  else {
    sVar8 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  iVar1 = (this->dim_).current_size_;
  index = 0;
  if (0 < iVar1) {
    lVar7 = 0;
    do {
      puVar5 = (ulong *)google::protobuf::RepeatedField<long>::Get(&this->dim_,index);
      lVar3 = 0x3f;
      if ((*puVar5 | 1) != 0) {
        for (; (*puVar5 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      lVar7 = lVar7 + (ulong)((int)lVar3 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (iVar1 != index);
    if (lVar7 != 0) {
      if ((int)(uint)lVar7 < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar4 = (uint)lVar7 | 1;
        iVar1 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
          }
        }
        uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
      }
      sVar8 = sVar8 + uVar6;
      goto LAB_003eeb8d;
    }
  }
  lVar7 = 0;
LAB_003eeb8d:
  this->_dim_cached_byte_size_ = (int)lVar7;
  this->_cached_size_ = (int)(sVar8 + lVar7);
  return sVar8 + lVar7;
}

Assistant:

size_t BlobShape::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.BlobShape)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated int64 dim = 1 [packed = true];
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->dim_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _dim_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}